

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcAbs.c
# Opt level: O0

int Wlc_NtkPdrAbs(Wlc_Ntk_t *p,Wlc_Par_t *pPars)

{
  int iVar1;
  Wla_Man_t *pWla_00;
  int RetValue;
  Wla_Man_t *pWla;
  Wlc_Par_t *pPars_local;
  Wlc_Ntk_t *p_local;
  
  pWla_00 = Wla_ManStart(p,pPars);
  iVar1 = Wla_ManSolve(pWla_00,pPars);
  Wla_ManStop(pWla_00);
  return iVar1;
}

Assistant:

int Wlc_NtkPdrAbs( Wlc_Ntk_t * p, Wlc_Par_t * pPars )
{
    Wla_Man_t * pWla = NULL;
    
    int RetValue = -1;

    pWla = Wla_ManStart( p, pPars );

    RetValue = Wla_ManSolve( pWla, pPars );

    Wla_ManStop( pWla );
    
    return RetValue;
}